

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_releasetmp(ASMState *as,IRRef ref)

{
  byte bVar1;
  Reg r;
  IRIns *ir;
  IRRef ref_local;
  ASMState *as_local;
  
  bVar1 = (&as->ir->field_1)[ref].r;
  as->freeset = 1 << (bVar1 & 0x1f) | as->freeset;
  as->modset = 1 << (bVar1 & 0x1f) | as->modset;
  (&as->ir->field_1)[ref].r = 0xff;
  return (uint)bVar1;
}

Assistant:

static Reg ra_releasetmp(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  Reg r = ir->r;
  lj_assertA(ra_hasreg(r), "release of TMP%d has no reg", ref-ASMREF_TMP1+1);
  lj_assertA(!ra_hasspill(ir->s),
	     "release of TMP%d has spill slot [%x]", ref-ASMREF_TMP1+1, ir->s);
  ra_free(as, r);
  ra_modified(as, r);
  ir->r = RID_INIT;
  return r;
}